

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O2

void DC16NoLeft_C(uint8_t *dst)

{
  long lVar1;
  uint uVar2;
  
  uVar2 = 8;
  for (lVar1 = -0x10; lVar1 != 0; lVar1 = lVar1 + 1) {
    uVar2 = uVar2 + dst[lVar1 + -0x10];
  }
  Put16(uVar2 >> 4,dst);
  return;
}

Assistant:

static void DC16NoLeft_C(uint8_t* dst) {  // DC with left samples not available
  int DC = 8;
  int i;
  for (i = 0; i < 16; ++i) {
    DC += dst[i - BPS];
  }
  Put16(DC >> 4, dst);
}